

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::SectionParser::parse(SectionParser *this,istream *input,ForceField *ff,int lineNo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  long *plVar4;
  size_t sVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  uint uVar7;
  ulong uVar8;
  SectionParser *this_00;
  string line;
  string filteredLine;
  char buffer [65535];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_100d8;
  ulong uStack_100d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_100c8;
  SectionParser *pSStack_100b8;
  locale alStack_100b0 [8];
  undefined1 auStack_100a8 [32];
  string sStack_10088;
  undefined1 *puStack_10068;
  undefined8 uStack_10060;
  undefined1 uStack_10058;
  undefined7 uStack_10057;
  ForceField *pFStack_10048;
  istream *piStack_10040;
  char acStack_10038 [65544];
  
  auStack_100a8._0_8_ = auStack_100a8 + 0x10;
  auStack_100a8._8_8_ = (pointer)0x0;
  auStack_100a8[0x10] = 0;
  puStack_10068 = &uStack_10058;
  uStack_10060 = 0;
  uStack_10058 = 0;
  paVar1 = &sStack_10088.field_2;
  uVar7 = lineNo + 1;
  pSStack_100b8 = this;
  pFStack_10048 = ff;
  piStack_10040 = input;
  while( true ) {
    std::ios::widen((char)input->_vptr_basic_istream[-3] + (char)input);
    plVar4 = (long *)std::istream::getline((char *)input,(long)acStack_10038,-1);
    if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) break;
    paStack_100d8 = &aStack_100c8;
    sVar5 = strlen(acStack_10038);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&paStack_100d8,acStack_10038,acStack_10038 + sVar5);
    std::locale::locale(alStack_100b0);
    paVar2 = paStack_100d8;
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<OpenMD::Utils::trimLeft(std::__cxx11::string&,std::locale_const&)::_lambda(auto:1)_1_>>
                      (paStack_100d8,(undefined1 *)(uStack_100d0 + (long)paStack_100d8),
                       alStack_100b0);
    uVar8 = (long)paVar2 - (long)paStack_100d8;
    if (paStack_100d8->_M_local_buf + uStack_100d0 == _Var6._M_current) {
      paStack_100d8->_M_local_buf[uVar8] = '\0';
      uStack_100d0 = uVar8;
    }
    else {
      std::__cxx11::string::_M_erase((ulong)&paStack_100d8,uVar8);
    }
    if (paStack_100d8 == &aStack_100c8) {
      sStack_10088.field_2._8_8_ = aStack_100c8._8_8_;
      sStack_10088._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      sStack_10088._M_dataplus._M_p = (pointer)paStack_100d8;
    }
    sStack_10088.field_2._M_allocated_capacity._1_7_ = aStack_100c8._M_allocated_capacity._1_7_;
    sStack_10088.field_2._M_local_buf[0] = aStack_100c8._M_local_buf[0];
    sStack_10088._M_string_length = uStack_100d0;
    uStack_100d0 = 0;
    aStack_100c8._M_local_buf[0] = '\0';
    paStack_100d8 = &aStack_100c8;
    std::__cxx11::string::operator=((string *)auStack_100a8,(string *)(auStack_100a8 + 0x20));
    input = piStack_10040;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_10088._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_10088._M_dataplus._M_p,sStack_10088.field_2._M_allocated_capacity + 1);
    }
    std::locale::~locale(alStack_100b0);
    if (paStack_100d8 != &aStack_100c8) {
      operator_delete(paStack_100d8,
                      CONCAT71(aStack_100c8._M_allocated_capacity._1_7_,aStack_100c8._M_local_buf[0]
                              ) + 1);
    }
    this_00 = (SectionParser *)auStack_100a8;
    bVar3 = isEndSection(pSStack_100b8,(string *)auStack_100a8);
    if (bVar3) break;
    if ((((pointer)auStack_100a8._8_8_ != (pointer)0x0) &&
        ((((pointer)auStack_100a8._8_8_ == (pointer)0x1 || (*(char *)auStack_100a8._0_8_ != '/')) ||
         (*(char *)(auStack_100a8._0_8_ + 1) != '/')))) &&
       ((*(char *)auStack_100a8._0_8_ != '#' && (*(char *)auStack_100a8._0_8_ != '!')))) {
      stripComments((string *)(auStack_100a8 + 0x20),this_00,(string *)auStack_100a8);
      std::__cxx11::string::operator=((string *)&puStack_10068,(string *)(auStack_100a8 + 0x20));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_10088._M_dataplus._M_p != paVar1) {
        operator_delete(sStack_10088._M_dataplus._M_p,sStack_10088.field_2._M_allocated_capacity + 1
                       );
      }
      (*pSStack_100b8->_vptr_SectionParser[3])
                (pSStack_100b8,pFStack_10048,&puStack_10068,(ulong)uVar7);
    }
    uVar7 = uVar7 + 1;
  }
  if (puStack_10068 != &uStack_10058) {
    operator_delete(puStack_10068,CONCAT71(uStack_10057,uStack_10058) + 1);
  }
  if ((undefined1 *)auStack_100a8._0_8_ != auStack_100a8 + 0x10) {
    operator_delete((void *)auStack_100a8._0_8_,
                    CONCAT71(auStack_100a8._17_7_,auStack_100a8[0x10]) + 1);
  }
  return;
}

Assistant:

void SectionParser::parse(std::istream& input, ForceField& ff, int lineNo) {
    const int bufferSize = 65535;
    char buffer[bufferSize];
    std::string line, filteredLine;
    while (input.getline(buffer, bufferSize)) {
      ++lineNo;
      line = Utils::trimLeftCopy(buffer);
      // a line begins with "//" is comment
      // let's also call lines starting with # and ! as comments
      if (isEndSection(line)) {
        break;
      } else if (line.empty() ||
                 (line.size() >= 2 && line[0] == '/' && line[1] == '/') ||
                 (line.size() >= 1 && line[0] == '#') ||
                 (line.size() >= 1 && line[0] == '!')) {
        continue;
      } else {
        filteredLine = stripComments(line);
        parseLine(ff, filteredLine, lineNo);
      }
    }
  }